

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint readChunk_mDCv(LodePNGInfo *info,uchar *data,size_t chunkLength)

{
  size_t chunkLength_local;
  uchar *data_local;
  LodePNGInfo *info_local;
  uint local_4;
  
  if (chunkLength == 0x18) {
    info->mdcv_defined = 1;
    info->mdcv_red_x = (uint)*data * 0x100 + (uint)data[1];
    info->mdcv_red_y = (uint)data[2] * 0x100 + (uint)data[3];
    info->mdcv_green_x = (uint)data[4] * 0x100 + (uint)data[5];
    info->mdcv_green_y = (uint)data[6] * 0x100 + (uint)data[7];
    info->mdcv_blue_x = (uint)data[8] * 0x100 + (uint)data[9];
    info->mdcv_blue_y = (uint)data[10] * 0x100 + (uint)data[0xb];
    info->mdcv_white_x = (uint)data[0xc] * 0x100 + (uint)data[0xd];
    info->mdcv_white_y = (uint)data[0xe] * 0x100 + (uint)data[0xf];
    info->mdcv_max_luminance =
         (uint)data[0x10] * 0x1000000 + (uint)data[0x11] * 0x10000 + (uint)data[0x12] * 0x100 +
         (uint)data[0x13];
    info->mdcv_min_luminance =
         (uint)data[0x14] * 0x1000000 + (uint)data[0x15] * 0x10000 + (uint)data[0x16] * 0x100 +
         (uint)data[0x17];
    local_4 = 0;
  }
  else {
    local_4 = 0x77;
  }
  return local_4;
}

Assistant:

static unsigned readChunk_mDCv(LodePNGInfo* info, const unsigned char* data, size_t chunkLength) {
  if(chunkLength != 24) return 119; /*invalid mDCv chunk size*/

  info->mdcv_defined = 1;
  info->mdcv_red_x = 256u * data[0] + data[1];
  info->mdcv_red_y = 256u * data[2] + data[3];
  info->mdcv_green_x = 256u * data[4] + data[5];
  info->mdcv_green_y = 256u * data[6] + data[7];
  info->mdcv_blue_x = 256u * data[8] + data[9];
  info->mdcv_blue_y = 256u * data[10] + data[11];
  info->mdcv_white_x = 256u * data[12] + data[13];
  info->mdcv_white_y = 256u * data[14] + data[15];
  info->mdcv_max_luminance = 16777216u * data[16] + 65536u * data[17] + 256u * data[18] + data[19];
  info->mdcv_min_luminance = 16777216u * data[20] + 65536u * data[21] + 256u * data[22] + data[23];

  return 0; /* OK */
}